

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall Search::predictor::reset(predictor *this)

{
  predictor *in_RDI;
  predictor *unaff_retaddr;
  
  erase_oracles(in_RDI);
  erase_alloweds(unaff_retaddr);
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)in_RDI);
  v_array<char>::clear((v_array<char> *)in_RDI);
  free_ec(in_RDI);
  return in_RDI;
}

Assistant:

predictor& predictor::reset()
{
  this->erase_oracles();
  this->erase_alloweds();
  condition_on_tags.clear();
  condition_on_names.clear();
  free_ec();
  return *this;
}